

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O2

void __thiscall AvlTree<Worker>::insert<Worker>(AvlTree<Worker> *this,Worker *obj)

{
  __shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  _insert((AvlTree<Worker> *)&local_20,&this->m_Root,(Worker *)this);
  std::__shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void insert(T1&& obj)
   {
        m_Root = _insert(m_Root, obj);
   }